

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

int __thiscall particleSamples::read_in_particle_samples_gzipped(particleSamples *this)

{
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_00;
  iterator __position;
  vector<particle_info,std::allocator<particle_info>> *this_01;
  undefined4 uVar1;
  undefined8 this_02;
  int iVar2;
  istream *piVar3;
  long lVar4;
  anon_struct_120_15_f999644b *paVar5;
  particleSamples *ppVar6;
  iterator __position_00;
  long lVar7;
  byte bVar8;
  int n_particle;
  int temp_monval;
  string temp_string;
  particle_info temp_particle_info;
  stringstream temp1;
  stringstream temp2;
  int local_3f4;
  undefined1 local_3f0 [24];
  pointer local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [16];
  anon_struct_120_15_f999644b local_3b8;
  undefined1 local_340 [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_2c0 [8];
  string local_1b8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_138 [8];
  
  bVar8 = 0;
  ppVar6 = (particleSamples *)this->full_particle_list;
  clear_out_previous_record
            (this,(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)ppVar6);
  local_3d8 = (pointer)local_3c8;
  local_3d0 = (pointer)0x0;
  local_3c8[0] = 0;
  if (0 < this->event_buffer_size) {
    local_3f0._8_8_ = abStack_138;
    local_3f0._16_8_ = abStack_2c0;
    lVar7 = 0;
    local_3f4 = 0;
    do {
      this_02 = local_3f0._8_8_;
      gz_readline_abi_cxx11_((string *)local_340,ppVar6,this->inputfile_gz);
      std::__cxx11::string::operator=((string *)&local_3d8,(string *)local_340);
      if ((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_ !=
          (vector<particle_info,_std::allocator<particle_info>_> *)(local_340 + 0x10)) {
        operator_delete((void *)local_340._0_8_);
      }
      iVar2 = gzeof(this->inputfile_gz);
      if (iVar2 != 0) break;
      this_00 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                 *)this->full_particle_list;
      local_340._0_8_ = operator_new(0x18);
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_00 + 8);
      if (__position._M_current ==
          *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_00 + 0x10)) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  (this_00,__position,
                   (vector<particle_info,_std::allocator<particle_info>_> **)local_340);
      }
      else {
        *__position._M_current =
             (vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_340,(string *)&local_3d8,_S_out|_S_in);
      ppVar6 = (particleSamples *)local_3f0;
      std::istream::operator>>((istream *)local_340,(int *)ppVar6);
      if (0 < (int)local_3f0._0_4_) {
        iVar2 = 0;
        do {
          gz_readline_abi_cxx11_(local_1b8,ppVar6,this->inputfile_gz);
          std::__cxx11::string::operator=((string *)&local_3d8,(string *)local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
            operator_delete(local_1b8[0]._M_dataplus._M_p);
          }
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_3d8,_S_out|_S_in);
          std::istream::operator>>((istream *)local_1b8,(int *)(local_3f0 + 4));
          local_3b8.monval = local_3f0._4_4_;
          piVar3 = std::istream::_M_extract<double>((double *)local_1b8);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          std::istream::_M_extract<double>((double *)piVar3);
          this_01 = (vector<particle_info,std::allocator<particle_info>> *)
                    (this->full_particle_list->
                    super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar7];
          __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_01 + 8);
          if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_01 + 0x10)) {
            std::vector<particle_info,std::allocator<particle_info>>::
            _M_realloc_insert<particle_info_const&>(this_01,__position_00,&local_3b8);
          }
          else {
            paVar5 = &local_3b8;
            for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
              uVar1 = *(undefined4 *)&paVar5->field_0x4;
              (__position_00._M_current)->monval = paVar5->monval;
              *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar1;
              paVar5 = (anon_struct_120_15_f999644b *)((long)paVar5 + ((ulong)bVar8 * -2 + 1) * 8);
              __position_00._M_current = __position_00._M_current + (ulong)bVar8 * -0x10 + 8;
            }
            *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x78;
          }
          ppVar6 = (particleSamples *)&std::__cxx11::stringstream::VTT;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)this_02);
          iVar2 = iVar2 + 1;
        } while (iVar2 < (int)local_3f0._0_4_);
      }
      local_3f4 = local_3f4 + local_3f0._0_4_;
      lVar7 = lVar7 + 1;
      ppVar6 = (particleSamples *)&std::__cxx11::stringstream::VTT;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base((ios_base *)local_3f0._16_8_);
    } while (local_3f4 < this->event_buffer_size);
  }
  if (local_3d8 != (pointer)local_3c8) {
    operator_delete(local_3d8);
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_gzipped() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int n_particle;
    int temp_monval;
    int num_particles = 0;
    int ievent = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_gz);

        if (gzeof(inputfile_gz)) break;

        // create one event
        full_particle_list->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;

        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_gz);
            std::stringstream temp2(temp_string);
            temp2 >> temp_monval;
            particle_info temp_particle_info;
            temp_particle_info.monval = temp_monval;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;

            (*full_particle_list)[ievent]->push_back(temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}